

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O1

string * __thiscall
cmNinjaTargetGenerator::LanguageCompilerRule
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,string *lang)

{
  size_type *psVar1;
  pointer pcVar2;
  string *name;
  undefined8 *puVar3;
  ulong uVar4;
  undefined8 uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ulong *local_60;
  long local_58;
  ulong local_50 [2];
  string local_40;
  
  pcVar2 = (lang->_M_dataplus)._M_p;
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar2,pcVar2 + lang->_M_string_length);
  std::__cxx11::string::append((char *)&local_60);
  name = cmGeneratorTarget::GetName_abi_cxx11_
                   ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  cmGlobalNinjaGenerator::EncodeRuleName(&local_40,name);
  uVar4 = 0xf;
  if (local_60 != local_50) {
    uVar4 = local_50[0];
  }
  if (uVar4 < local_40._M_string_length + local_58) {
    uVar5 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      uVar5 = local_40.field_2._M_allocated_capacity;
    }
    if (local_40._M_string_length + local_58 <= (ulong)uVar5) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_40,0,(char *)0x0,(ulong)local_60);
      goto LAB_00438131;
    }
  }
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_60,(ulong)local_40._M_dataplus._M_p);
LAB_00438131:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar3 + 2;
  if ((size_type *)*puVar3 == psVar1) {
    uVar5 = puVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar5;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar3[1];
  *puVar3 = psVar1;
  puVar3[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaTargetGenerator::LanguageCompilerRule(
  const std::string& lang) const
{
  return lang + "_COMPILER__" +
    cmGlobalNinjaGenerator::EncodeRuleName(this->GeneratorTarget->GetName());
}